

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureNaNTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailureNanAndInf_DoublesEqualExpectedIsInf_Test::testBody
          (TEST_TestFailureNanAndInf_DoublesEqualExpectedIsInf_Test *this)

{
  undefined *fileName;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_a8 [56];
  DoublesEqualFailure f;
  TEST_TestFailureNanAndInf_DoublesEqualExpectedIsInf_Test *this_local;
  
  fileName = (anonymous_namespace)::failFileName;
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailureNanAndInf).test;
  f.super_TestFailure.message_.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)(local_a8 + 0x20),"");
  DoublesEqualFailure::DoublesEqualFailure
            ((DoublesEqualFailure *)(local_a8 + 0x30),pUVar1,fileName,2,INFINITY,2.0,3.0,
             (SimpleString *)(local_a8 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_a8 + 0x20));
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_a8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_a8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"expected <Inf - Infinity>\n\tbut was  <2> threshold used was <3>",pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureNaNTest.cpp"
             ,0x57,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_a8);
  DoublesEqualFailure::~DoublesEqualFailure((DoublesEqualFailure *)(local_a8 + 0x30));
  return;
}

Assistant:

TEST(TestFailureNanAndInf, DoublesEqualExpectedIsInf)
{
    DoublesEqualFailure f(test, failFileName, failLineNumber, (double)INFINITY, 2.0, 3.0, "");
    FAILURE_EQUAL("expected <Inf - Infinity>\n"
                "\tbut was  <2> threshold used was <3>", f);
}